

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_rolemaskproxymodel.cpp
# Opt level: O2

void __thiscall tst_RoleMaskProxyModel::testUseRoleMask_data(tst_RoleMaskProxyModel *this)

{
  QAbstractItemModel *pQVar1;
  QTestData *pQVar2;
  initializer_list<QModelIndex> args;
  initializer_list<QModelIndex> args_00;
  initializer_list<QModelIndex> args_01;
  bool local_f9;
  QAbstractItemModel *baseModel;
  QModelIndex local_f0;
  ulong local_d8 [6];
  QModelIndex local_a8;
  undefined1 local_90 [24];
  undefined1 local_78 [24];
  bool local_60 [24];
  undefined8 local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  QTest::addColumn<QAbstractItemModel*>("baseModel",(QAbstractItemModel **)0x0);
  QTest::addColumn<QList<QModelIndex>>("magicNumerIndexes",(QList<QModelIndex> *)0x0);
  QTest::addColumnInternal(1,"userRoleEditable");
  baseModel = createListModel(&this->super_QObject);
  pQVar2 = (QTestData *)QTest::newRow("List");
  pQVar2 = ::operator<<(pQVar2,&baseModel);
  local_d8[3] = 0xffffffffffffffff;
  local_d8[4] = 0;
  local_d8[5] = 0;
  (**(code **)(*(long *)baseModel + 0x60))(&local_f0,baseModel,0,0);
  args._M_len = 1;
  args._M_array = &local_f0;
  QList<QModelIndex>::QList((QList<QModelIndex> *)&local_a8,args);
  pQVar2 = ::operator<<(pQVar2,(QList<QModelIndex> *)&local_a8);
  local_d8[0] = local_d8[0] & 0xffffffffffffff00;
  ::operator<<(pQVar2,(bool *)local_d8);
  QArrayDataPointer<QModelIndex>::~QArrayDataPointer((QArrayDataPointer<QModelIndex> *)&local_a8);
  baseModel = createTableModel(&this->super_QObject);
  if (baseModel != (QAbstractItemModel *)0x0) {
    pQVar2 = (QTestData *)QTest::newRow("Table");
    pQVar2 = ::operator<<(pQVar2,&baseModel);
    local_d8[3] = 0xffffffffffffffff;
    local_d8[4] = 0;
    local_d8[5] = 0;
    (**(code **)(*(long *)baseModel + 0x60))(&local_a8,baseModel,1,0);
    local_d8[0] = 0xffffffffffffffff;
    local_d8[1] = 0;
    local_d8[2] = 0;
    (**(code **)(*(long *)baseModel + 0x60))(local_90,baseModel,0,1);
    args_00._M_len = 2;
    args_00._M_array = &local_a8;
    QList<QModelIndex>::QList((QList<QModelIndex> *)&local_f0,args_00);
    pQVar2 = ::operator<<(pQVar2,(QList<QModelIndex> *)&local_f0);
    local_60[0] = true;
    ::operator<<(pQVar2,local_60);
    QArrayDataPointer<QModelIndex>::~QArrayDataPointer((QArrayDataPointer<QModelIndex> *)&local_f0);
  }
  baseModel = createTreeModel(&this->super_QObject);
  if (baseModel != (QAbstractItemModel *)0x0) {
    pQVar2 = (QTestData *)QTest::newRow("Tree");
    pQVar2 = ::operator<<(pQVar2,&baseModel);
    local_d8[3] = 0xffffffffffffffff;
    local_d8[4] = 0;
    local_d8[5] = 0;
    (**(code **)(*(long *)baseModel + 0x60))(&local_a8,baseModel,1,0);
    local_d8[0] = 0xffffffffffffffff;
    local_d8[1] = 0;
    local_d8[2] = 0;
    (**(code **)(*(long *)baseModel + 0x60))(local_90,baseModel,0,1);
    pQVar1 = baseModel;
    local_48 = 0xffffffffffffffff;
    local_40 = 0;
    uStack_38 = 0;
    (**(code **)(*(long *)baseModel + 0x60))(local_60,baseModel,0,0);
    (**(code **)(*(long *)pQVar1 + 0x60))(local_78,pQVar1,0,1,local_60);
    args_01._M_len = 3;
    args_01._M_array = &local_a8;
    QList<QModelIndex>::QList((QList<QModelIndex> *)&local_f0,args_01);
    pQVar2 = ::operator<<(pQVar2,(QList<QModelIndex> *)&local_f0);
    local_f9 = true;
    ::operator<<(pQVar2,&local_f9);
    QArrayDataPointer<QModelIndex>::~QArrayDataPointer((QArrayDataPointer<QModelIndex> *)&local_f0);
  }
  return;
}

Assistant:

void tst_RoleMaskProxyModel::testUseRoleMask_data()
{
    QTest::addColumn<QAbstractItemModel *>("baseModel");
    QTest::addColumn<QModelIndexList>("magicNumerIndexes");
    QTest::addColumn<bool>("userRoleEditable");
    QAbstractItemModel *baseModel = createListModel(this);
    QTest::newRow("List") << baseModel << QModelIndexList({baseModel->index(0, 0)}) << false;
    baseModel = createTableModel(this);
    if (baseModel)
        QTest::newRow("Table") << baseModel << QModelIndexList({baseModel->index(1, 0), baseModel->index(0, 1)}) << true;
    baseModel = createTreeModel(this);
    if (baseModel)
        QTest::newRow("Tree") << baseModel
                              << QModelIndexList({baseModel->index(1, 0), baseModel->index(0, 1), baseModel->index(0, 1, baseModel->index(0, 0))})
                              << true;
}